

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

cmLinkImplementationLibraries * __thiscall
cmGeneratorTarget::GetLinkImplementationLibrariesInternal
          (cmGeneratorTarget *this,string *config,cmGeneratorTarget *head)

{
  bool bVar1;
  pointer ppVar2;
  byte local_99;
  cmOptionalLinkImplementation *impl;
  _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>
  local_70;
  _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>
  local_68 [3];
  map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
  *local_50;
  HeadToLinkImplementationMap *hm;
  string CONFIG;
  cmGeneratorTarget *head_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  CONFIG.field_2._8_8_ = head;
  bVar1 = IsImported(this);
  if (bVar1) {
    this_local = (cmGeneratorTarget *)0x0;
  }
  else {
    cmsys::SystemTools::UpperCase((string *)&hm,config);
    local_50 = &std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::HeadToLinkImplementationMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::HeadToLinkImplementationMap>_>_>
                ::operator[](&this->LinkImplMap,(string *)&hm)->
                super_map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
    ;
    bVar1 = std::
            map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
            ::empty(local_50);
    local_99 = 0;
    if (!bVar1) {
      local_68[0]._M_node =
           (_Base_ptr)
           std::
           map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
           ::begin(local_50);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>
               ::operator->(local_68);
      local_99 = (ppVar2->second).HadHeadSensitiveCondition ^ 0xff;
    }
    if ((local_99 & 1) == 0) {
      this_local = (cmGeneratorTarget *)
                   std::
                   map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
                   ::operator[](local_50,(key_type *)((long)&CONFIG.field_2 + 8));
      if (((this_local->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color &
          _S_black) == _S_red) {
        *(undefined1 *)
         &(this_local->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
             _S_black;
        ComputeLinkImplementationLibraries
                  (this,config,(cmOptionalLinkImplementation *)this_local,
                   (cmGeneratorTarget *)CONFIG.field_2._8_8_);
      }
    }
    else {
      local_70._M_node =
           (_Base_ptr)
           std::
           map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
           ::begin(local_50);
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>
               ::operator->(&local_70);
      this_local = (cmGeneratorTarget *)&ppVar2->second;
    }
    std::__cxx11::string::~string((string *)&hm);
  }
  return (cmLinkImplementationLibraries *)this_local;
}

Assistant:

cmLinkImplementationLibraries const*
cmGeneratorTarget::GetLinkImplementationLibrariesInternal(
    const std::string& config, cmGeneratorTarget const* head) const
{
  // There is no link implementation for imported targets.
  if(this->IsImported())
    {
    return 0;
    }

  // Populate the link implementation libraries for this configuration.
  std::string CONFIG = cmSystemTools::UpperCase(config);
  HeadToLinkImplementationMap& hm =
    this->LinkImplMap[CONFIG];

  // If the link implementation does not depend on the head target
  // then return the one we computed first.
  if(!hm.empty() && !hm.begin()->second.HadHeadSensitiveCondition)
    {
    return &hm.begin()->second;
    }

  cmOptionalLinkImplementation& impl = hm[head];
  if(!impl.LibrariesDone)
    {
    impl.LibrariesDone = true;
    this->ComputeLinkImplementationLibraries(config, impl, head);
    }
  return &impl;
}